

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FOCC-OTA-cs16btech11038.cpp
# Opt level: O3

ssize_t __thiscall FOCC_OTA::read(FOCC_OTA *this,int __fd,void *__buf,size_t __nbytes)

{
  set<Transaction_*,_TransCompare,_std::allocator<Transaction_*>_> *this_00;
  Transaction *this_01;
  DataItem *pDVar1;
  char cVar2;
  int iVar3;
  mapped_type *ppTVar4;
  int __fd_00;
  ssize_t sVar5;
  pair<std::_Rb_tree_iterator<Transaction_*>,_std::_Rb_tree_iterator<Transaction_*>_> pVar6;
  pair<std::_Rb_tree_iterator<Transaction_*>,_bool> pVar7;
  Transaction *cur;
  Transaction *local_48;
  int local_3c;
  int *local_38;
  
  local_3c = __fd;
  std::__shared_mutex_pthread::lock_shared(&(this->scheduler_lock)._M_impl);
  __fd_00 = (int)__buf;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)
                             &(this->dataItems).
                              super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl.
                              super__Vector_impl_data._M_start[__fd_00]->lock);
  if (iVar3 == 0) {
    local_38 = (int *)__nbytes;
    ppTVar4 = std::
              map<int,_Transaction_*,_std::less<int>,_std::allocator<std::pair<const_int,_Transaction_*>_>_>
              ::operator[](&this->transactions,&local_3c);
    this_01 = *ppTVar4;
    local_48 = this_01;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this_01->t_status_mtx);
    if (iVar3 == 0) {
      cVar2 = Transaction::getStatus(this_01);
      pDVar1 = (this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>._M_impl
               .super__Vector_impl_data._M_start[__fd_00];
      this_00 = &pDVar1->read_list;
      if (cVar2 == 'a') {
        pVar6 = std::
                _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
                ::equal_range(&this_00->_M_t,&local_48);
        std::
        _Rb_tree<Transaction_*,_Transaction_*,_std::_Identity<Transaction_*>,_TransCompare,_std::allocator<Transaction_*>_>
        ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar6.first._M_node,(_Base_ptr)pVar6.second._M_node
                      );
        sVar5 = 0xfffffffe;
      }
      else {
        pVar7 = std::
                _Rb_tree<Transaction*,Transaction*,std::_Identity<Transaction*>,TransCompare,std::allocator<Transaction*>>
                ::_M_insert_unique<Transaction*const&>
                          ((_Rb_tree<Transaction*,Transaction*,std::_Identity<Transaction*>,TransCompare,std::allocator<Transaction*>>
                            *)this_00,&local_48);
        *local_38 = pDVar1->value;
        Transaction::read(local_48,__fd_00,pVar7._8_8_,(size_t)local_38);
        sVar5 = 0;
      }
      pthread_mutex_unlock((pthread_mutex_t *)&local_48->t_status_mtx);
      pthread_mutex_unlock
                ((pthread_mutex_t *)
                 &(this->dataItems).super__Vector_base<DataItem_*,_std::allocator<DataItem_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[__fd_00]->lock);
      pthread_rwlock_unlock((pthread_rwlock_t *)&this->scheduler_lock);
      return sVar5;
    }
  }
  std::__throw_system_error(iVar3);
}

Assistant:

int FOCC_OTA::read(int tid, int dIdx, int *store) {
    scheduler_lock.lock_shared();
    dataItems[dIdx]->lock.lock();

    Transaction *cur = transactions[tid];
    cur->t_status_mtx.lock();

    if(cur->getStatus()=='a'){

        // remove this transaction from the read list of this data item.
        dataItems[dIdx]->read_list.erase(cur);

        cur->t_status_mtx.unlock();
        dataItems[dIdx]->lock.unlock();
        scheduler_lock.unlock_shared();

        return -2;
    }

    DataItem* curItem = dataItems[dIdx];
    curItem->read_list.insert(cur);
    *store = curItem->value;
    // This function just adds dIdx to the readSet!
    cur->read(dIdx);

    cur->t_status_mtx.unlock();
    dataItems[dIdx]->lock.unlock();
    scheduler_lock.unlock_shared();

    return 0;
}